

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  ushort uVar1;
  sqlite3 *psVar2;
  Mem *pMVar3;
  uint uVar4;
  Vdbe *pVVar5;
  char cVar6;
  uchar uVar7;
  int nName;
  long lVar8;
  char *pcVar9;
  long lVar10;
  uchar *puVar11;
  int iVar12;
  ulong uVar13;
  int nTotal;
  int iVar14;
  int idx;
  StrAccum out;
  int tokenType;
  Vdbe *local_e8;
  sqlite3 *local_e0;
  Mem utf8;
  char zBase [100];
  
  idx = 0;
  psVar2 = p->db;
  out.mxAlloc = psVar2->aLimit[0];
  out.zText = zBase;
  out.db = (sqlite3 *)0x0;
  out.nAlloc = 100;
  out.nChar = 0;
  out.accError = '\0';
  out.printfFlags = '\0';
  if (psVar2->nVdbeExec < 2) {
    if (p->nVar == 0) {
      iVar12 = sqlite3Strlen30(zRawSql);
      sqlite3_str_append(&out,zRawSql,iVar12);
    }
    else {
      iVar12 = 1;
      local_e8 = p;
      local_e0 = psVar2;
      while (*zRawSql != '\0') {
        uVar7 = '\x01';
        iVar14 = 0;
        puVar11 = (uchar *)zRawSql;
        while ((nName = 0, uVar7 != '\0' &&
               (nName = sqlite3GetToken(puVar11,&tokenType), tokenType != 0x94))) {
          iVar14 = iVar14 + nName;
          uVar7 = puVar11[nName];
          puVar11 = puVar11 + nName;
        }
        sqlite3_str_append(&out,zRawSql,iVar14);
        pVVar5 = local_e8;
        if (nName == 0) break;
        puVar11 = (uchar *)zRawSql + iVar14;
        if (*puVar11 == '?') {
          if (1 < nName) {
            sqlite3GetInt32((char *)(puVar11 + 1),&idx);
            iVar12 = idx;
          }
        }
        else {
          iVar12 = sqlite3VdbeParameterIndex(local_e8,(char *)puVar11,nName);
        }
        idx = iVar12;
        zRawSql = (char *)(puVar11 + nName);
        pMVar3 = pVVar5->aVar;
        lVar8 = (long)idx;
        iVar12 = idx + 1;
        uVar1 = pMVar3[lVar8 + -1].flags;
        if ((uVar1 & 1) == 0) {
          if ((uVar1 & 4) == 0) {
            if ((uVar1 & 8) == 0) {
              if ((uVar1 & 2) == 0) {
                if ((uVar1 >> 0xe & 1) == 0) {
                  sqlite3_str_append(&out,"x\'",2);
                  uVar4 = pMVar3[lVar8 + -1].n;
                  if (pMVar3[lVar8 + -1].n < 1) {
                    uVar4 = 0;
                  }
                  for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
                    sqlite3_str_appendf(&out,"%02x",(ulong)(byte)pMVar3[lVar8 + -1].z[uVar13]);
                  }
                  sqlite3_str_append(&out,"\'",1);
                }
                else {
                  sqlite3_str_appendf(&out,"zeroblob(%d)",(ulong)(uint)pMVar3[lVar8 + -1].u.nZero);
                }
              }
              else if (local_e0->enc == '\x01') {
                sqlite3_str_appendf(&out,"\'%.*q\'",(ulong)(uint)pMVar3[lVar8 + -1].n,
                                    pMVar3[lVar8 + -1].z);
              }
              else {
                utf8.szMalloc = 0;
                utf8.uTemp = 0;
                utf8.z = (char *)0x0;
                utf8.zMalloc = (char *)0x0;
                utf8.xDel = (_func_void_void_ptr *)0x0;
                utf8.u.r = 0.0;
                utf8.flags = 0;
                utf8.enc = '\0';
                utf8.eSubtype = '\0';
                utf8.n = 0;
                utf8.db = local_e0;
                sqlite3VdbeMemSetStr
                          (&utf8,pMVar3[lVar8 + -1].z,pMVar3[lVar8 + -1].n,local_e0->enc,
                           (_func_void_void_ptr *)0x0);
                iVar14 = sqlite3VdbeChangeEncoding(&utf8,1);
                if (iVar14 == 7) {
                  out.accError = '\a';
                  out.nAlloc = 0;
                }
                sqlite3_str_appendf(&out,"\'%.*q\'",(ulong)utf8._8_8_ >> 0x20,utf8.z);
                sqlite3VdbeMemRelease(&utf8);
              }
            }
            else {
              sqlite3_str_appendf(&out,"%!.15g",pMVar3[lVar8 + -1].u.nZero);
            }
          }
          else {
            sqlite3_str_appendf(&out,"%lld",pMVar3[lVar8 + -1].u.r);
          }
        }
        else {
          sqlite3_str_append(&out,"NULL",4);
        }
      }
    }
  }
  else {
    for (; cVar6 = *zRawSql, lVar8 = 1, cVar6 != '\0'; zRawSql = zRawSql + lVar10) {
      do {
        lVar10 = lVar8;
        if (cVar6 == '\n') break;
        cVar6 = zRawSql[lVar10];
        lVar8 = lVar10 + 1;
      } while (cVar6 != '\0');
      sqlite3_str_append(&out,"-- ",3);
      sqlite3_str_append(&out,zRawSql,(int)lVar10);
    }
  }
  if (out.accError != '\0') {
    sqlite3_str_reset(&out);
  }
  pcVar9 = sqlite3StrAccumFinish(&out);
  return pcVar9;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, 0, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}